

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O3

int imcomp_compress_tile
              (fitsfile *outfptr,long row,int datatype,void *tiledata,long tilelen,long tilenx,
              long tileny,int nullcheck,void *nullflagval,int *status)

{
  float fVar1;
  double dVar2;
  double zero;
  uint nullval;
  long firstrow;
  uint uVar3;
  ulong uVar4;
  size_t sVar5;
  int iVar6;
  size_t sVar7;
  int iVar8;
  int npix;
  fitsfile *outfptr_00;
  char *pcVar9;
  double *pdVar10;
  FITSfile *pFVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  void *in_stack_ffffffffffffff38;
  int intlength;
  short *cbuf;
  size_t local_a8;
  long local_a0;
  double *local_98;
  int flag;
  long local_88;
  size_t clen;
  undefined1 local_78 [16];
  long hcomp_len;
  double bzero [1];
  double bscale [1];
  double noise3;
  size_t gzip_nelem;
  double noise5;
  double noise2;
  
  flag = 1;
  gzip_nelem = 0;
  bscale[0] = 1.0;
  bzero[0] = 0.0;
  if (0 < *status) {
    return *status;
  }
  pFVar11 = outfptr->Fptr;
  if ((((pFVar11->quantize_level == 9999.0) && (!NAN(pFVar11->quantize_level))) &&
      (1 < pFVar11->compress_type - 0x15U)) &&
     (((datatype - 0x2aU < 0x2a && ((0x30000000001U >> ((ulong)(datatype - 0x2aU) & 0x3f) & 1) != 0)
       ) || (datatype == 0xa3)))) {
    ffpmsg("Lossless compression of floating point images must use GZIP (imcomp_compress_tile)");
    *status = 0x19d;
    return 0x19d;
  }
  outfptr_00 = (fitsfile *)pFVar11->tilerow;
  if ((outfptr_00 != (fitsfile *)0x0) &&
     (iVar8 = (int)((row + -1) % ((pFVar11->znaxis[0] + -1) / pFVar11->tilesize[0] + 1)),
     (&outfptr_00->HDUposition)[iVar8] == row)) {
    local_a8 = tilelen;
    local_98 = (double *)tiledata;
    if (pFVar11->tiledata[iVar8] != (void *)0x0) {
      free(pFVar11->tiledata[iVar8]);
      pFVar11 = outfptr->Fptr;
    }
    outfptr_00 = (fitsfile *)pFVar11->tilenullarray[iVar8];
    if (outfptr_00 != (fitsfile *)0x0) {
      free(outfptr_00);
      pFVar11 = outfptr->Fptr;
    }
    pFVar11->tiledata[iVar8] = (void *)0x0;
    outfptr->Fptr->tilenullarray[iVar8] = (void *)0x0;
    pFVar11 = outfptr->Fptr;
    pFVar11->tilerow[iVar8] = 0;
    pFVar11->tiledatasize[iVar8] = 0;
    pFVar11->tiletype[iVar8] = 0;
    pFVar11->tileanynull[iVar8] = 0;
    tilelen = local_a8;
    tiledata = local_98;
  }
  if (pFVar11->compress_type == -1) {
    imcomp_write_nocompress_tile
              (outfptr,row,datatype,tiledata,tilelen,(int)tilenx,in_stack_ffffffffffffff38,status);
    return *status;
  }
  iVar8 = 0;
  if (pFVar11->cn_zblank == -1) {
    iVar8 = nullcheck;
  }
  uVar3 = pFVar11->zbitpix;
  pdVar10 = (double *)(ulong)uVar3;
  if ((int)uVar3 < 1) {
    iVar8 = nullcheck;
  }
  nullval = pFVar11->zblank;
  local_a8 = (size_t)nullval;
  dVar2 = pFVar11->cn_bscale;
  zero = pFVar11->cn_bzero;
  local_88 = tilenx;
  if (datatype < 0x1f) {
    if (datatype < 0x14) {
      if (datatype == 0xb) {
        local_a0 = row;
        local_98 = pdVar10;
        imcomp_convert_tile_tbyte
                  (outfptr,tiledata,tilelen,iVar8,nullflagval,nullval,uVar3,dVar2,zero,&intlength,
                   status);
      }
      else {
        local_a0 = row;
        local_98 = pdVar10;
        if (datatype != 0xc) goto LAB_0017d813;
        imcomp_convert_tile_tsbyte
                  (outfptr,tiledata,tilelen,iVar8,nullflagval,nullval,uVar3,dVar2,zero,&intlength,
                   status);
      }
    }
    else if (datatype == 0x14) {
      local_a0 = row;
      local_98 = pdVar10;
      imcomp_convert_tile_tushort
                (outfptr,tiledata,tilelen,iVar8,nullflagval,nullval,uVar3,dVar2,zero,&intlength,
                 status);
    }
    else if (datatype == 0x15) {
      local_a0 = row;
      local_98 = pdVar10;
      imcomp_convert_tile_tshort
                (outfptr,tiledata,tilelen,iVar8,nullflagval,nullval,uVar3,dVar2,zero,
                 pFVar11->cn_actual_bzero,&intlength,status);
    }
    else {
      local_a0 = row;
      local_98 = pdVar10;
      if (datatype != 0x1e) goto LAB_0017d813;
      imcomp_convert_tile_tuint
                (outfptr_00,tiledata,tilelen,iVar8,nullflagval,nullval,uVar3,dVar2,zero,&intlength,
                 status);
    }
  }
  else if (datatype < 0x29) {
    if (datatype != 0x1f) {
      if (datatype == 0x28) {
        pcVar9 = "Unsigned integer*8 datatype is not supported when writing to compressed images";
        goto LAB_0017d81a;
      }
LAB_0017d813:
      pcVar9 = "unsupported image datatype (imcomp_compress_tile)";
LAB_0017d81a:
      ffpmsg(pcVar9);
      *status = 0x19a;
      return 0x19a;
    }
    local_a0 = row;
    local_98 = pdVar10;
    imcomp_convert_tile_tint
              (outfptr_00,tiledata,tilelen,iVar8,nullflagval,nullval,uVar3,dVar2,zero,&intlength,
               status);
  }
  else {
    if (datatype == 0x29) {
      pcVar9 = "Integer*8 Long datatype is not supported when writing to compressed images";
      goto LAB_0017d81a;
    }
    if (datatype == 0x2a) {
      local_a0 = row;
      local_98 = pdVar10;
      imcomp_convert_tile_tfloat
                (outfptr,row,tiledata,tilelen,tilenx,tileny,iVar8,nullflagval,nullval,uVar3,dVar2,
                 zero,&intlength,&flag,bscale,bzero,status);
    }
    else {
      if (datatype != 0x52) goto LAB_0017d813;
      local_a0 = row;
      local_98 = pdVar10;
      imcomp_convert_tile_tdouble
                (outfptr,row,tiledata,tilelen,tilenx,tileny,iVar8,nullflagval,nullval,uVar3,dVar2,
                 zero,&intlength,&flag,bscale,bzero,status);
    }
  }
  if (0 < *status) {
    return *status;
  }
  pFVar11 = outfptr->Fptr;
  if (flag == 0) {
    if (pFVar11->cn_gzip_data < 1) {
      pcVar9 = "1QB";
      if (pFVar11->request_huge_hdu == 0) {
        pcVar9 = "1PB";
      }
      fficol(outfptr,999,"GZIP_COMPRESSED_DATA",pcVar9,status);
      if (*status < 1) {
        ffgcno(outfptr,0,"GZIP_COMPRESSED_DATA",&outfptr->Fptr->cn_gzip_data,status);
      }
    }
    if (datatype == 0x2a) {
      sVar7 = tilelen * 4;
      auVar12._8_4_ = (int)(sVar7 >> 0x20);
      auVar12._0_8_ = sVar7;
      auVar12._12_4_ = 0x45300000;
      dVar2 = ((auVar12._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sVar7) - 4503599627370496.0)) * 1.1;
      uVar4 = (ulong)dVar2;
      clen = (long)(dVar2 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4;
      cbuf = (short *)calloc(clen,1);
      if (cbuf == (short *)0x0) {
LAB_0017d9f4:
        ffpmsg("Memory allocation error. (imcomp_compress_tile)");
        *status = 0x71;
        return 0x71;
      }
      if ((iVar8 == 1) && (0 < tilelen)) {
        fVar14 = *nullflagval;
        sVar5 = 0;
        do {
          fVar1 = *(float *)((long)tiledata + sVar5 * 4);
          if ((fVar1 == fVar14) && (!NAN(fVar1) && !NAN(fVar14))) {
            *(undefined4 *)((long)tiledata + sVar5 * 4) = 0xffffffff;
          }
          sVar5 = sVar5 + 1;
        } while (tilelen != sVar5);
      }
      ffswap4((int *)tiledata,tilelen);
    }
    else {
      sVar7 = tilelen * 8;
      auVar13._8_4_ = (int)(sVar7 >> 0x20);
      auVar13._0_8_ = sVar7;
      auVar13._12_4_ = 0x45300000;
      dVar2 = ((auVar13._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sVar7) - 4503599627370496.0)) * 1.1;
      uVar4 = (ulong)dVar2;
      clen = (long)(dVar2 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4;
      cbuf = (short *)calloc(clen,1);
      if (cbuf == (short *)0x0) goto LAB_0017d9f4;
      if ((iVar8 == 1) && (0 < tilelen)) {
        dVar2 = *nullflagval;
        sVar5 = 0;
        do {
          if ((*(double *)((long)tiledata + sVar5 * 8) == dVar2) &&
             (!NAN(*(double *)((long)tiledata + sVar5 * 8)) && !NAN(dVar2))) {
            *(double *)((long)tiledata + sVar5 * 8) = -NAN;
          }
          sVar5 = sVar5 + 1;
        } while (tilelen != sVar5);
      }
      ffswap8((double *)tiledata,tilelen);
    }
    compress2mem_from_mem((char *)tiledata,sVar7,(char **)&cbuf,&clen,realloc,&gzip_nelem,status);
    ffpclb(outfptr,outfptr->Fptr->cn_gzip_data,local_a0,1,gzip_nelem,(uchar *)cbuf,status);
    goto LAB_0017de8e;
  }
  clen = pFVar11->maxelem;
  local_78._0_8_ = clen;
  cbuf = (short *)calloc(clen,1);
  if (cbuf == (short *)0x0) {
    ffpmsg("Memory allocation failure. (imcomp_compress_tile)");
    *status = 0x71;
    return 0x71;
  }
  iVar6 = pFVar11->compress_type;
  npix = (int)tilelen;
  if (iVar6 < 0x1f) {
    if (iVar6 - 0x15U < 2) {
      fVar14 = pFVar11->quantize_level;
      if (((datatype == 0x2a) && (fVar14 == 9999.0)) && (!NAN(fVar14))) {
        ffswap4((int *)tiledata,tilelen);
        iVar6 = outfptr->Fptr->compress_type;
        goto joined_r0x0017dd1a;
      }
      if (((datatype != 0x52) || (fVar14 != 9999.0)) || (NAN(fVar14))) {
        if (intlength != 1) {
          if (intlength == 4) {
            ffswap4((int *)tiledata,tilelen);
            iVar6 = outfptr->Fptr->compress_type;
          }
          else if (intlength == 2) {
            ffswap2((short *)tiledata,tilelen);
            if (outfptr->Fptr->compress_type == 0x16) {
              fits_shuffle_2bytes((char *)tiledata,tilelen,status);
            }
            tilelen = tilelen * 2;
            goto LAB_0017dacb;
          }
joined_r0x0017dd1a:
          if (iVar6 == 0x16) {
            fits_shuffle_4bytes((char *)tiledata,tilelen,status);
          }
          tilelen = tilelen << 2;
        }
      }
      else {
        ffswap8((double *)tiledata,tilelen);
        if (outfptr->Fptr->compress_type == 0x16) {
          fits_shuffle_8bytes((char *)tiledata,tilelen,status);
        }
        tilelen = tilelen << 3;
      }
LAB_0017dacb:
      compress2mem_from_mem
                ((char *)tiledata,tilelen,(char **)&cbuf,&clen,realloc,&gzip_nelem,status);
      iVar8 = outfptr->Fptr->cn_compressed;
      sVar7 = gzip_nelem;
    }
    else {
      if (iVar6 != 0xb) goto LAB_0017de21;
      iVar8 = pFVar11->rice_blocksize;
      iVar6 = local_78._0_4_;
      if (intlength == 1) {
        uVar3 = fits_rcomp_byte((char *)tiledata,npix,(uchar *)cbuf,iVar6,iVar8);
      }
      else if (intlength == 2) {
        uVar3 = fits_rcomp_short((short *)tiledata,npix,(uchar *)cbuf,iVar6,iVar8);
      }
      else {
        uVar3 = fits_rcomp((int *)tiledata,npix,(uchar *)cbuf,iVar6,iVar8);
      }
      if ((int)uVar3 < 0) {
        free(cbuf);
        pcVar9 = "error Rice compressing image tile (imcomp_compress_tile)";
        goto LAB_0017dcf2;
      }
      iVar8 = outfptr->Fptr->cn_compressed;
      sVar7 = (size_t)uVar3;
    }
LAB_0017de18:
    ffpclb(outfptr,iVar8,local_a0,1,sVar7,(uchar *)cbuf,status);
  }
  else {
    if (iVar6 == 0x33) {
      if (intlength == 4) {
        ffswap4((int *)tiledata,tilelen);
      }
      else if (intlength == 2) {
        ffswap2((short *)tiledata,tilelen);
      }
      pcVar9 = "bzip2 compression error";
LAB_0017dcf2:
      ffpmsg(pcVar9);
      *status = 0x19d;
      return 0x19d;
    }
    if (iVar6 == 0x29) {
      fVar14 = pFVar11->hcomp_scale;
      if (fVar14 <= 0.0) {
        iVar8 = (int)local_88;
        if (fVar14 < 0.0) {
          fVar14 = -fVar14;
        }
        iVar6 = (int)local_98;
        hcomp_len = local_78._0_8_;
      }
      else {
        local_78 = ZEXT416((uint)fVar14);
        fits_img_stats_int((int *)tiledata,local_88,tileny,iVar8,(int)local_a8,(long *)0x0,
                           (int *)0x0,(int *)0x0,(double *)0x0,(double *)0x0,(double *)0x0,&noise2,
                           &noise3,&noise5,status);
        if (((noise2 != 0.0) || (NAN(noise2))) && (noise2 < noise3)) {
          noise3 = noise2;
        }
        iVar8 = (int)local_88;
        iVar6 = (int)local_98;
        if (((noise5 != 0.0) || (NAN(noise5))) && (noise5 < noise3)) {
          noise3 = noise5;
        }
        fVar14 = (float)(noise3 * (double)(float)local_78._0_4_);
        hcomp_len = clen;
      }
      if ((iVar6 == 0x10) || (iVar6 == 8)) {
        fits_hcompress((int *)tiledata,iVar8,(int)tileny,(int)(fVar14 + 0.5),(char *)cbuf,&hcomp_len
                       ,status);
      }
      else {
        fits_int_to_longlong_inplace((int *)tiledata,tilelen,status);
        fits_hcompress64((LONGLONG *)tiledata,iVar8,(int)tileny,(int)(fVar14 + 0.5),(char *)cbuf,
                         &hcomp_len,status);
      }
      iVar8 = outfptr->Fptr->cn_compressed;
      sVar7 = hcomp_len;
      goto LAB_0017de18;
    }
    if (iVar6 == 0x1f) {
      if (0 < tilelen) {
        sVar7 = 0;
        do {
          if (0xffffff < *(uint *)((long)tiledata + sVar7 * 4)) {
            pcVar9 = "data out of range for PLIO compression (0 - 2**24)";
            goto LAB_0017dcf2;
          }
          sVar7 = sVar7 + 1;
        } while (tilelen != sVar7);
      }
      uVar3 = pl_p2li((int *)tiledata,1,cbuf,npix);
      if ((int)uVar3 < 0) {
        free(cbuf);
        pcVar9 = "error PLIO compressing image tile (imcomp_compress_tile)";
        goto LAB_0017dcf2;
      }
      ffpcli(outfptr,outfptr->Fptr->cn_compressed,local_a0,1,(ulong)uVar3,cbuf,status);
    }
  }
LAB_0017de21:
  firstrow = local_a0;
  iVar8 = outfptr->Fptr->cn_zscale;
  if (0 < iVar8) {
    ffpcld(outfptr,iVar8,local_a0,1,1,bscale,status);
    ffpcld(outfptr,outfptr->Fptr->cn_zzero,firstrow,1,1,bzero,status);
  }
LAB_0017de8e:
  free(cbuf);
  return *status;
}

Assistant:

int imcomp_compress_tile (fitsfile *outfptr,
    long row,  /* tile number = row in the binary table that holds the compressed data */
    int datatype, 
    void *tiledata, 
    long tilelen,
    long tilenx,
    long tileny,
    int nullcheck,
    void *nullflagval,
    int *status)

/*
   This is the main compression routine.

   This routine does the following to the input tile of pixels:
        - if it is a float or double image, then it quantizes the pixels
        - compresses the integer pixel values
        - writes the compressed byte stream to the FITS file.

   If the tile cannot be quantized than the raw float or double values
   are losslessly compressed with gzip and then written to the output table.
   
   This input array may be modified by this routine.  If the array is of type TINT
   or TFLOAT, and the compression type is HCOMPRESS, then it must have been 
   allocated to be twice as large (8 bytes per pixel) to provide scratch space.

  Note that this routine does not fully support the implicit datatype conversion that
  is supported when writing to normal FITS images.  The datatype of the input array
  must have the same datatype (either signed or unsigned) as the output (compressed)
  FITS image in some cases.
*/
{
    int *idata;		/* quantized integer data */
    int cn_zblank, zbitpix, nullval;
    int flag = 1;  /* true by default; only = 0 if float data couldn't be quantized */
    int intlength;      /* size of integers to be compressed */
    double scale, zero, actual_bzero;
    long ii;
    size_t clen;		/* size of cbuf */
    short *cbuf;	/* compressed data */
    int  nelem = 0;		/* number of bytes */
    int tilecol;
    size_t gzip_nelem = 0;
    unsigned int bzlen;
    int ihcompscale;
    float hcompscale;
    double noise2, noise3, noise5;
    double bscale[1] = {1.}, bzero[1] = {0.};	/* scaling parameters */
    long  hcomp_len;
    LONGLONG *lldata;

    if (*status > 0)
        return(*status);

    /* check for special case of losslessly compressing floating point */
    /* images.  Only compression algorithm that supports this is GZIP */
    if ( (outfptr->Fptr)->quantize_level == NO_QUANTIZE) {
       if (((outfptr->Fptr)->compress_type != GZIP_1) &&
           ((outfptr->Fptr)->compress_type != GZIP_2)) {
           switch (datatype) {
            case TFLOAT:
            case TDOUBLE:
            case TCOMPLEX:
            case TDBLCOMPLEX:
              ffpmsg("Lossless compression of floating point images must use GZIP (imcomp_compress_tile)");
              return(*status = DATA_COMPRESSION_ERR);
            default:
              break;
          }
       }
    }

    /* free the previously saved tile if the input tile is for the same row */
    if ((outfptr->Fptr)->tilerow) {  /* has the tile cache been allocated? */

      /* calculate the column bin of the compressed tile */
      tilecol = (row - 1) % ((long)(((outfptr->Fptr)->znaxis[0] - 1) / ((outfptr->Fptr)->tilesize[0])) + 1);
      
      if ((outfptr->Fptr)->tilerow[tilecol] == row) {
        if (((outfptr->Fptr)->tiledata)[tilecol]) {
            free(((outfptr->Fptr)->tiledata)[tilecol]);
        }
	  
        if (((outfptr->Fptr)->tilenullarray)[tilecol]) {
            free(((outfptr->Fptr)->tilenullarray)[tilecol]);
        }

        ((outfptr->Fptr)->tiledata)[tilecol] = 0;
        ((outfptr->Fptr)->tilenullarray)[tilecol] = 0;
        (outfptr->Fptr)->tilerow[tilecol] = 0;
        (outfptr->Fptr)->tiledatasize[tilecol] = 0;
        (outfptr->Fptr)->tiletype[tilecol] = 0;
        (outfptr->Fptr)->tileanynull[tilecol] = 0;
      }
    }

    if ( (outfptr->Fptr)->compress_type == NOCOMPRESS) {
         /* Special case when using NOCOMPRESS for diagnostic purposes in fpack */
         if (imcomp_write_nocompress_tile(outfptr, row, datatype, tiledata, tilelen, 
	     nullcheck, nullflagval, status) > 0) {
             return(*status);
         }
         return(*status);
    }

    /* =========================================================================== */
    /* initialize various parameters */
    idata = (int *) tiledata;   /* may overwrite the input tiledata in place */

    /* zbitpix is the BITPIX keyword value in the uncompressed FITS image */
    zbitpix = (outfptr->Fptr)->zbitpix;

    /* if the tile/image has an integer datatype, see if a null value has */
    /* been defined (with the BLANK keyword in a normal FITS image).  */
    /* If so, and if the input tile array also contains null pixels, */
    /* (represented by pixels that have a value = nullflagval) then  */
    /* any pixels whose value = nullflagval, must be set to the value = nullval */
    /* before the pixel array is compressed.  These null pixel values must */
    /* not be inverse scaled by the BSCALE/BZERO values, if present. */

    cn_zblank = (outfptr->Fptr)->cn_zblank;
    nullval = (outfptr->Fptr)->zblank;

    if (zbitpix > 0 && cn_zblank != -1)  /* If the integer image has no defined null */
        nullcheck = 0;    /* value, then don't bother checking input array for nulls. */

    /* if the BSCALE and BZERO keywords exist, then the input values must */
    /* be inverse scaled by this factor, before the values are compressed. */
    /* (The program may have turned off scaling, which over rides the keywords) */
    
    scale = (outfptr->Fptr)->cn_bscale;
    zero  = (outfptr->Fptr)->cn_bzero;
    actual_bzero = (outfptr->Fptr)->cn_actual_bzero;

    /* =========================================================================== */
    /* prepare the tile of pixel values for compression */
    if (datatype == TSHORT) {
       imcomp_convert_tile_tshort(outfptr, tiledata, tilelen, nullcheck, nullflagval,
           nullval, zbitpix, scale, zero, actual_bzero, &intlength, status);
    } else if (datatype == TUSHORT) {
       imcomp_convert_tile_tushort(outfptr, tiledata, tilelen, nullcheck, nullflagval,
           nullval, zbitpix, scale, zero, &intlength, status);
    } else if (datatype == TBYTE) {
       imcomp_convert_tile_tbyte(outfptr, tiledata, tilelen, nullcheck, nullflagval,
           nullval, zbitpix, scale, zero,  &intlength, status);
    } else if (datatype == TSBYTE) {
       imcomp_convert_tile_tsbyte(outfptr, tiledata, tilelen, nullcheck, nullflagval,
           nullval, zbitpix, scale, zero,  &intlength, status);
    } else if (datatype == TINT) {
       imcomp_convert_tile_tint(outfptr, tiledata, tilelen, nullcheck, nullflagval,
           nullval, zbitpix, scale, zero, &intlength, status);
    } else if (datatype == TUINT) {
       imcomp_convert_tile_tuint(outfptr, tiledata, tilelen, nullcheck, nullflagval,
           nullval, zbitpix, scale, zero, &intlength, status);
    } else if (datatype == TLONG && sizeof(long) == 8) {
           ffpmsg("Integer*8 Long datatype is not supported when writing to compressed images");
           return(*status = BAD_DATATYPE);
    } else if (datatype == TULONG && sizeof(long) == 8) {
           ffpmsg("Unsigned integer*8 datatype is not supported when writing to compressed images");
           return(*status = BAD_DATATYPE);
    } else if (datatype == TFLOAT) {
        imcomp_convert_tile_tfloat(outfptr, row, tiledata, tilelen, tilenx, tileny, nullcheck,
        nullflagval, nullval, zbitpix, scale, zero, &intlength, &flag, bscale, bzero, status);
    } else if (datatype == TDOUBLE) {
       imcomp_convert_tile_tdouble(outfptr, row, tiledata, tilelen, tilenx, tileny, nullcheck,
       nullflagval, nullval, zbitpix, scale, zero, &intlength, &flag, bscale, bzero, status);
    } else {
          ffpmsg("unsupported image datatype (imcomp_compress_tile)");
          return(*status = BAD_DATATYPE);
    }

    if (*status > 0)
      return(*status);      /* return if error occurs */

    /* =========================================================================== */
    if (flag)   /* now compress the integer data array */
    {
        /* allocate buffer for the compressed tile bytes */
        clen = (outfptr->Fptr)->maxelem;
        cbuf = (short *) calloc (clen, sizeof (unsigned char));

        if (cbuf == NULL) {
            ffpmsg("Memory allocation failure. (imcomp_compress_tile)");
	    return (*status = MEMORY_ALLOCATION);
        }

        /* =========================================================================== */
        if ( (outfptr->Fptr)->compress_type == RICE_1)
        {
            if (intlength == 2) {
  	        nelem = fits_rcomp_short ((short *)idata, tilelen, (unsigned char *) cbuf,
                       clen, (outfptr->Fptr)->rice_blocksize);
            } else if (intlength == 1) {
  	        nelem = fits_rcomp_byte ((signed char *)idata, tilelen, (unsigned char *) cbuf,
                       clen, (outfptr->Fptr)->rice_blocksize);
            } else {
  	        nelem = fits_rcomp (idata, tilelen, (unsigned char *) cbuf,
                       clen, (outfptr->Fptr)->rice_blocksize);
            }

	    if (nelem < 0)  /* data compression error condition */
            {
	        free (cbuf);
                ffpmsg("error Rice compressing image tile (imcomp_compress_tile)");
                return (*status = DATA_COMPRESSION_ERR);
            }

	    /* Write the compressed byte stream. */
            ffpclb(outfptr, (outfptr->Fptr)->cn_compressed, row, 1,
                     nelem, (unsigned char *) cbuf, status);
        }

        /* =========================================================================== */
        else if ( (outfptr->Fptr)->compress_type == PLIO_1)
        {
              for (ii = 0; ii < tilelen; ii++)  {
                if (idata[ii] < 0 || idata[ii] > 16777215)
                {
                   /* plio algorithn only supports positive 24 bit ints */
                   ffpmsg("data out of range for PLIO compression (0 - 2**24)");
                   return(*status = DATA_COMPRESSION_ERR);
                }
              }

  	      nelem = pl_p2li (idata, 1, cbuf, tilelen);

	      if (nelem < 0)  /* data compression error condition */
              {
	        free (cbuf);
                ffpmsg("error PLIO compressing image tile (imcomp_compress_tile)");
                return (*status = DATA_COMPRESSION_ERR);
              }

	      /* Write the compressed byte stream. */
              ffpcli(outfptr, (outfptr->Fptr)->cn_compressed, row, 1,
                     nelem, cbuf, status);
        }

        /* =========================================================================== */
        else if ( ((outfptr->Fptr)->compress_type == GZIP_1) ||
                  ((outfptr->Fptr)->compress_type == GZIP_2) )   {

	    if ((outfptr->Fptr)->quantize_level == NO_QUANTIZE && datatype == TFLOAT) {
	      /* Special case of losslessly compressing floating point pixels with GZIP */
	      /* In this case we compress the input tile array directly */

#if BYTESWAPPED
               ffswap4((int*) tiledata, tilelen); 
#endif
               if ( (outfptr->Fptr)->compress_type == GZIP_2 )
		    fits_shuffle_4bytes((char *) tiledata, tilelen, status);

                compress2mem_from_mem((char *) tiledata, tilelen * sizeof(float),
                    (char **) &cbuf,  &clen, realloc, &gzip_nelem, status);

	    } else if ((outfptr->Fptr)->quantize_level == NO_QUANTIZE && datatype == TDOUBLE) {
	      /* Special case of losslessly compressing double pixels with GZIP */
	      /* In this case we compress the input tile array directly */

#if BYTESWAPPED
               ffswap8((double *) tiledata, tilelen); 
#endif
               if ( (outfptr->Fptr)->compress_type == GZIP_2 )
		    fits_shuffle_8bytes((char *) tiledata, tilelen, status);

                compress2mem_from_mem((char *) tiledata, tilelen * sizeof(double),
                    (char **) &cbuf,  &clen, realloc, &gzip_nelem, status);

	    } else {

	        /* compress the integer idata array */

#if BYTESWAPPED
	       if (intlength == 2)
                 ffswap2((short *) idata, tilelen); 
	       else if (intlength == 4)
                 ffswap4(idata, tilelen); 
#endif

               if (intlength == 2) {

                  if ( (outfptr->Fptr)->compress_type == GZIP_2 )
		    fits_shuffle_2bytes((char *) tiledata, tilelen, status);

                  compress2mem_from_mem((char *) idata, tilelen * sizeof(short),
                   (char **) &cbuf,  &clen, realloc, &gzip_nelem, status);

               } else if (intlength == 1) {

                  compress2mem_from_mem((char *) idata, tilelen * sizeof(unsigned char),
                   (char **) &cbuf,  &clen, realloc, &gzip_nelem, status);

               } else {

                  if ( (outfptr->Fptr)->compress_type == GZIP_2 )
		    fits_shuffle_4bytes((char *) tiledata, tilelen, status);

                  compress2mem_from_mem((char *) idata, tilelen * sizeof(int),
                   (char **) &cbuf,  &clen, realloc, &gzip_nelem, status);
               }
            }

	    /* Write the compressed byte stream. */
            ffpclb(outfptr, (outfptr->Fptr)->cn_compressed, row, 1,
                     gzip_nelem, (unsigned char *) cbuf, status);

        /* =========================================================================== */
        } else if ( (outfptr->Fptr)->compress_type == BZIP2_1) {

#if BYTESWAPPED
	   if (intlength == 2)
               ffswap2((short *) idata, tilelen); 
	   else if (intlength == 4)
               ffswap4(idata, tilelen); 
#endif

           bzlen = (unsigned int) clen;
	   
           /* call bzip2 with blocksize = 900K, verbosity = 0, and default workfactor */

/*  bzip2 is not supported in the public release.  This is only for test purposes.
           if (BZ2_bzBuffToBuffCompress( (char *) cbuf, &bzlen,
	         (char *) idata, (unsigned int) (tilelen * intlength), 9, 0, 0) ) 
*/
	   {
                   ffpmsg("bzip2 compression error");
                   return(*status = DATA_COMPRESSION_ERR);
           }

	    /* Write the compressed byte stream. */
            ffpclb(outfptr, (outfptr->Fptr)->cn_compressed, row, 1,
                     bzlen, (unsigned char *) cbuf, status);

        /* =========================================================================== */
        }  else if ( (outfptr->Fptr)->compress_type == HCOMPRESS_1)     {
	    /*
	      if hcompscale is positive, then we have to multiply
	      the value by the RMS background noise to get the 
	      absolute scale value.  If negative, then it gives the
	      absolute scale value directly.
	    */
            hcompscale = (outfptr->Fptr)->hcomp_scale;

	    if (hcompscale > 0.) {
	       fits_img_stats_int(idata, tilenx, tileny, nullcheck,
	                nullval, 0,0,0,0,0,0,&noise2,&noise3,&noise5,status);

		/* use the minimum of the 3 noise estimates */
		if (noise2 != 0. && noise2 < noise3) noise3 = noise2;
		if (noise5 != 0. && noise5 < noise3) noise3 = noise5;
		
		hcompscale = (float) (hcompscale * noise3);

	    } else if (hcompscale < 0.) {

		hcompscale = hcompscale * -1.0F;
	    }

	    ihcompscale = (int) (hcompscale + 0.5);

            hcomp_len = clen;  /* allocated size of the buffer */
	    
            if (zbitpix == BYTE_IMG || zbitpix == SHORT_IMG) {
                fits_hcompress(idata, tilenx, tileny, 
		  ihcompscale, (char *) cbuf, &hcomp_len, status);

            } else {
                 /* have to convert idata to an I*8 array, in place */
                 /* idata must have been allocated large enough to do this */

                fits_int_to_longlong_inplace(idata, tilelen, status);
                lldata = (LONGLONG *) idata;		

                fits_hcompress64(lldata, tilenx, tileny, 
		  ihcompscale, (char *) cbuf, &hcomp_len, status);
            }

	    /* Write the compressed byte stream. */
            ffpclb(outfptr, (outfptr->Fptr)->cn_compressed, row, 1,
                     hcomp_len, (unsigned char *) cbuf, status);
        }

        /* =========================================================================== */
        if ((outfptr->Fptr)->cn_zscale > 0)
        {
              /* write the linear scaling parameters for this tile */
	      ffpcld (outfptr, (outfptr->Fptr)->cn_zscale, row, 1, 1,
                      bscale, status);
	      ffpcld (outfptr, (outfptr->Fptr)->cn_zzero,  row, 1, 1,
                      bzero,  status);
        }

        free(cbuf);  /* finished with this buffer */

    /* =========================================================================== */
    } else {    /* if flag == 0., floating point data couldn't be quantized */

	 /* losslessly compress the data with gzip. */

         /* if gzip2 compressed data column doesn't exist, create it */
         if ((outfptr->Fptr)->cn_gzip_data < 1) {
              if ( (outfptr->Fptr)->request_huge_hdu != 0) {
                 fits_insert_col(outfptr, 999, "GZIP_COMPRESSED_DATA", "1QB", status);
              } else {
                 fits_insert_col(outfptr, 999, "GZIP_COMPRESSED_DATA", "1PB", status);
              }

                 if (*status <= 0)  /* save the number of this column */
                       ffgcno(outfptr, CASEINSEN, "GZIP_COMPRESSED_DATA",
                                &(outfptr->Fptr)->cn_gzip_data, status);
         }

         if (datatype == TFLOAT)  {
               /* allocate buffer for the compressed tile bytes */
	       /* make it 10% larger than the original uncompressed data */
               clen = (size_t) (tilelen * sizeof(float) * 1.1);
               cbuf = (short *) calloc (clen, sizeof (unsigned char));

               if (cbuf == NULL)
               {
                   ffpmsg("Memory allocation error. (imcomp_compress_tile)");
	           return (*status = MEMORY_ALLOCATION);
               }

	       /* convert null values to NaNs in place, if necessary */
	       if (nullcheck == 1) {
	           imcomp_float2nan((float *) tiledata, tilelen, (int *) tiledata,
	               *(float *) (nullflagval), status);
	       }

#if BYTESWAPPED
               ffswap4((int*) tiledata, tilelen); 
#endif
               compress2mem_from_mem((char *) tiledata, tilelen * sizeof(float),
                    (char **) &cbuf,  &clen, realloc, &gzip_nelem, status);

         } else {  /* datatype == TDOUBLE */

               /* allocate buffer for the compressed tile bytes */
	       /* make it 10% larger than the original uncompressed data */
               clen = (size_t) (tilelen * sizeof(double) * 1.1);
               cbuf = (short *) calloc (clen, sizeof (unsigned char));

               if (cbuf == NULL)
               {
                   ffpmsg("Memory allocation error. (imcomp_compress_tile)");
	           return (*status = MEMORY_ALLOCATION);
               }

	       /* convert null values to NaNs in place, if necessary */
	       if (nullcheck == 1) {
	           imcomp_double2nan((double *) tiledata, tilelen, (LONGLONG *) tiledata,
	               *(double *) (nullflagval), status);
	       }

#if BYTESWAPPED
               ffswap8((double*) tiledata, tilelen); 
#endif
               compress2mem_from_mem((char *) tiledata, tilelen * sizeof(double),
                    (char **) &cbuf,  &clen, realloc, &gzip_nelem, status);
        }

	/* Write the compressed byte stream. */
        ffpclb(outfptr, (outfptr->Fptr)->cn_gzip_data, row, 1,
             gzip_nelem, (unsigned char *) cbuf, status);

        free(cbuf);  /* finished with this buffer */
    }

    return(*status);
}